

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O2

void __thiscall zmq::stream_engine_base_t::zap_msg_available(stream_engine_base_t *this)

{
  bool bVar1;
  int iVar2;
  mechanism_t *pmVar3;
  
  pmVar3 = this->_mechanism;
  if (pmVar3 == (mechanism_t *)0x0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","_mechanism != NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
            ,0x1fc);
    fflush(_stderr);
    zmq_abort("_mechanism != NULL");
    pmVar3 = this->_mechanism;
  }
  iVar2 = (*pmVar3->_vptr_mechanism_t[6])();
  if (iVar2 != -1) {
    if ((this->_input_stopped == true) && (bVar1 = restart_input(this), !bVar1)) {
      return;
    }
    if (this->_output_stopped != true) {
      return;
    }
    restart_output(this);
    return;
  }
  (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,0);
  return;
}

Assistant:

void zmq::stream_engine_base_t::zap_msg_available ()
{
    zmq_assert (_mechanism != NULL);

    const int rc = _mechanism->zap_msg_available ();
    if (rc == -1) {
        error (protocol_error);
        return;
    }
    if (_input_stopped)
        if (!restart_input ())
            return;
    if (_output_stopped)
        restart_output ();
}